

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O3

size_t derLDec(size_t *len,octet *der,size_t count)

{
  byte bVar1;
  size_t sVar2;
  ulong uVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  
  sVar2 = 0xffffffffffffffff;
  if (count != 0) {
    bVar1 = *der;
    uVar3 = (ulong)bVar1;
    if ((bVar1 != 0x80) && (bVar1 != 0xff)) {
      if ((char)bVar1 < '\0') {
        uVar5 = (ulong)(bVar1 & 0x7f);
        if (8 < (bVar1 & 0x7f) || count <= uVar5) {
          return sVar2;
        }
        if (der[1] == '\0') {
          return sVar2;
        }
        if ((bVar1 & 0x7f) == 1 && -1 < (char)der[1]) {
          return sVar2;
        }
        sVar4 = uVar5 + 1;
        if (uVar5 == 0) {
          uVar3 = 0;
        }
        else {
          uVar6 = 0;
          uVar3 = 0;
          do {
            uVar3 = (ulong)der[uVar6 + 1] | uVar3 << 8;
            uVar6 = uVar6 + 1;
          } while (uVar5 != uVar6);
          if (uVar3 == 0xffffffffffffffff) {
            return sVar2;
          }
        }
      }
      else {
        sVar4 = 1;
      }
      if (len != (size_t *)0x0) {
        *len = uVar3;
      }
      return sVar4;
    }
  }
  return sVar2;
}

Assistant:

static size_t derLDec(size_t* len, const octet der[], size_t count)
{
	size_t l_count = 1;
	size_t l;
	// не хватает буфера? неявная форма (0x80)? запрещенный октет (0xFF)?
	if (count < l_count || der[0] == 128 || der[0] == 255)
		return SIZE_MAX;
	// короткая форма?
	if (der[0] < 128)
		l = der[0];
	// длинная форма
	else
	{
		size_t r = der[0] - 128;
		l_count += r;
		// не хватает буфера? переполнение?
		// нулевой старший октет кода длины?
		// длина меньше 128?
		if (count < l_count || r > O_PER_S ||
			der[1] == 0 || 
			r == 1 && der[1] < 128)
			return SIZE_MAX;
		for (l = 0, r = 1; r < l_count; ++r)
			 l <<= 8, l |= (size_t)der[r];
		// переполнение?
		if (l == SIZE_MAX)
			return SIZE_MAX;
	}
	// возврат
	if (len)
	{
		ASSERT(memIsValid(len, sizeof(size_t)));
		*len = l;
	}
	return l_count;
}